

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O0

void Abc_NtkUpdateNameIds(Abc_Ntk_t *p)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  FILE *__stream;
  Vec_Int_t *p_00;
  Abc_Obj_t *pAVar8;
  bool bVar9;
  int local_428;
  int Counter;
  int fSeenSpace;
  int fCompl;
  int iVar;
  int c;
  int i;
  FILE *pFile;
  Abc_Obj_t *pObj;
  Vec_Int_t *vStarts;
  char pFileName [1000];
  Abc_Ntk_t *p_local;
  
  local_428 = 0;
  pFileName._992_8_ = p;
  iVar2 = Abc_NtkIsNetlist(p);
  if (iVar2 != 0) {
    __assert_fail("!Abc_NtkIsNetlist(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNames.c"
                  ,0x2fb,"void Abc_NtkUpdateNameIds(Abc_Ntk_t *)");
  }
  sVar5 = strlen(*(char **)(pFileName._992_8_ + 0x10));
  if (sVar5 < 1000) {
    if (*(long *)(pFileName._992_8_ + 0x1b8) == 0) {
      __assert_fail("p->vNameIds != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNames.c"
                    ,0x2fd,"void Abc_NtkUpdateNameIds(Abc_Ntk_t *)");
    }
    pcVar6 = Extra_FileNameGenericAppend(*(char **)(pFileName._992_8_ + 0x10),"");
    pcVar7 = Extra_FileNameExtension(*(char **)(pFileName._992_8_ + 0x10));
    sprintf((char *)&vStarts,"%s_%s_names.txt",pcVar6,pcVar7);
    __stream = fopen((char *)&vStarts,"r+");
    bVar1 = false;
    p_00 = Vec_IntAlloc(1000);
    Vec_IntPush(p_00,-1);
    while( true ) {
      iVar2 = fgetc(__stream);
      bVar9 = false;
      if (iVar2 != -1) {
        local_428 = local_428 + 1;
        bVar9 = local_428 != 0;
      }
      if (!bVar9) break;
      if ((iVar2 != 0x20) || (bVar1)) {
        if (iVar2 == 10) {
          bVar1 = false;
        }
      }
      else {
        Vec_IntPush(p_00,local_428);
        bVar1 = true;
      }
    }
    iVar = 0;
    do {
      iVar2 = Vec_PtrSize(*(Vec_Ptr_t **)(pFileName._992_8_ + 0x20));
      if (iVar2 <= iVar) {
        iVar2 = Vec_IntSize(p_00);
        printf("Saved %d names into file \"%s\".\n",(ulong)(iVar2 - 1),&vStarts);
        fclose(__stream);
        Vec_IntFree(p_00);
        Vec_IntFreeP((Vec_Int_t **)(pFileName._992_8_ + 0x1b8));
        return;
      }
      pAVar8 = Abc_NtkObj((Abc_Ntk_t *)pFileName._992_8_,iVar);
      if ((((pAVar8 != (Abc_Obj_t *)0x0) && (iVar != 0)) &&
          (iVar2 = Vec_IntSize(*(Vec_Int_t **)(pFileName._992_8_ + 0x1b8)), iVar < iVar2)) &&
         (iVar2 = Vec_IntEntry(*(Vec_Int_t **)(pFileName._992_8_ + 0x1b8),iVar), iVar2 != 0)) {
        iVar2 = Vec_IntEntry(*(Vec_Int_t **)(pFileName._992_8_ + 0x1b8),iVar);
        iVar2 = Abc_Lit2Var(iVar2);
        iVar3 = Vec_IntEntry(*(Vec_Int_t **)(pFileName._992_8_ + 0x1b8),iVar);
        iVar3 = Abc_LitIsCompl(iVar3);
        iVar4 = Vec_IntSize(p_00);
        if (iVar4 <= iVar2) {
          __assert_fail("iVar < Vec_IntSize(vStarts)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNames.c"
                        ,0x310,"void Abc_NtkUpdateNameIds(Abc_Ntk_t *)");
        }
        iVar2 = Vec_IntEntry(p_00,iVar2);
        fseek(__stream,(long)iVar2,0);
        pcVar6 = "";
        if (iVar3 != 0) {
          pcVar6 = "-";
        }
        fprintf(__stream,"%s%d",pcVar6,(ulong)(uint)iVar);
      }
      iVar = iVar + 1;
    } while( true );
  }
  __assert_fail("strlen(p->pSpec) < 1000",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNames.c"
                ,0x2fc,"void Abc_NtkUpdateNameIds(Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkUpdateNameIds( Abc_Ntk_t * p )
{
    char pFileName[1000];
    Vec_Int_t * vStarts;
    Abc_Obj_t * pObj;
    FILE * pFile;
    int i, c, iVar, fCompl, fSeenSpace, Counter = 0;
    assert( !Abc_NtkIsNetlist(p) );
    assert( strlen(p->pSpec) < 1000 );
    assert( p->vNameIds != NULL );
    sprintf( pFileName, "%s_%s_names.txt", Extra_FileNameGenericAppend(p->pSpec,""), Extra_FileNameExtension(p->pSpec) );
    pFile = fopen( pFileName, "r+" );
    // collect info about lines
    fSeenSpace = 0;
    vStarts = Vec_IntAlloc( 1000 );
    Vec_IntPush( vStarts, -1 );
    while ( (c = fgetc(pFile)) != EOF && ++Counter )
        if ( c == ' ' && !fSeenSpace )
            Vec_IntPush(vStarts, Counter), fSeenSpace = 1;
        else if ( c == '\n' )
            fSeenSpace = 0;
    // add info about names
    Abc_NtkForEachObj( p, pObj, i )
    {
        if ( i == 0 || i >= Vec_IntSize(p->vNameIds) || !Vec_IntEntry(p->vNameIds, i) )
            continue;
        iVar = Abc_Lit2Var( Vec_IntEntry(p->vNameIds, i) );
        fCompl = Abc_LitIsCompl( Vec_IntEntry(p->vNameIds, i) );
        assert( iVar < Vec_IntSize(vStarts) );
        fseek( pFile, Vec_IntEntry(vStarts, iVar), SEEK_SET );
        fprintf( pFile, "%s%d", fCompl? "-":"", i );
    }
    printf( "Saved %d names into file \"%s\".\n", Vec_IntSize(vStarts)-1, pFileName );
    fclose( pFile );
    Vec_IntFree( vStarts );
    Vec_IntFreeP( &p->vNameIds );
//    Abc_NtkForEachObj( p, pObj, i )
//        Abc_ObjPrint( stdout, pObj );
}